

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03-decompose.cpp
# Opt level: O0

void __thiscall anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  bool bVar1;
  failure *pfVar2;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  location local_1d0;
  C *local_1a8;
  C *local_1a0;
  expression_decomposer local_191;
  C **local_190;
  undefined1 local_188 [8];
  result failed_1;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  location local_98;
  C *local_70 [3];
  C *local_58;
  expression_decomposer local_49;
  C **local_48;
  undefined1 local_40 [8];
  result failed;
  C b;
  C a;
  anon_class_1_0_00000001 *this_local;
  
  do {
    local_58 = (C *)&failed.field_0x27;
    local_48 = (C **)lest::expression_decomposer::operator<<(&local_49,&local_58);
    local_70[0] = (C *)&failed.field_0x27;
    lest::expression_lhs<C*const&>::operator==
              ((result *)local_40,(expression_lhs<C*const&> *)&local_48,local_70);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_40);
    if (bVar1) {
      pfVar2 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/03-decompose.cpp"
                 ,&local_b9);
      lest::location::location(&local_98,(text *)local_b8,0x4c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"&a == &a",&local_e1);
      std::__cxx11::string::string(local_108,(string *)&failed);
      lest::failure::failure(pfVar2,&local_98,(string *)local_e0,(string *)local_108);
      __cxa_throw(pfVar2,&lest::failure::typeinfo,lest::failure::~failure);
    }
    lest::result::~result((result *)local_40);
    bVar1 = lest::is_false();
  } while (bVar1);
  do {
    local_1a0 = (C *)&failed.field_0x27;
    local_190 = (C **)lest::expression_decomposer::operator<<(&local_191,&local_1a0);
    local_1a8 = (C *)&failed.field_0x26;
    lest::expression_lhs<C*const&>::operator==
              ((result *)local_188,(expression_lhs<C*const&> *)&local_190,&local_1a8);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_188);
    if (bVar1) {
      pfVar2 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/03-decompose.cpp"
                 ,&local_1f1);
      lest::location::location(&local_1d0,(text *)local_1f0,0x4d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"&a == &b",&local_219);
      std::__cxx11::string::string(local_240,(string *)&failed_1);
      lest::failure::failure(pfVar2,&local_1d0,(string *)local_218,(string *)local_240);
      __cxa_throw(pfVar2,&lest::failure::typeinfo,lest::failure::~failure);
    }
    lest::result::~result((result *)local_188);
    bVar1 = lest::is_false();
  } while (bVar1);
  return;
}

Assistant:

bool t() { return true; }